

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# arena.c
# Opt level: O3

void duckdb_je_arena_handle_deferred_work(tsdn_t *tsdn,arena_t *arena)

{
  decay_t *decay;
  
  decay = &(arena->pa_shard).pac.decay_dirty;
  if ((arena->pa_shard).pac.decay_dirty.time_ms.repr == 0) {
    arena_decay_impl(tsdn,arena,decay,&((arena->pa_shard).pac.stats)->decay_dirty,
                     &(arena->pa_shard).pac.ecache_dirty,false,true);
  }
  if (((duckdb_je_background_thread_enabled_state.repr & 1U) != 0) &&
     ((duckdb_je_background_thread_info[(ulong)arena->ind % duckdb_je_max_background_threads].
       indefinite_sleep.repr & 1U) != 0)) {
    arena_maybe_do_deferred_work(tsdn,(arena_t *)(ulong)arena->ind,decay,0);
    return;
  }
  return;
}

Assistant:

void arena_handle_deferred_work(tsdn_t *tsdn, arena_t *arena) {
	witness_assert_depth_to_rank(tsdn_witness_tsdp_get(tsdn),
	    WITNESS_RANK_CORE, 0);

	if (decay_immediately(&arena->pa_shard.pac.decay_dirty)) {
		arena_decay_dirty(tsdn, arena, false, true);
	}
	arena_background_thread_inactivity_check(tsdn, arena, false);
}